

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O1

t_int * scalarover_perf8(t_int *w)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  t_int tVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  float fVar12;
  
  tVar8 = w[4];
  if ((int)tVar8 != 0) {
    fVar12 = *(float *)w[2];
    fVar12 = (float)(~-(uint)(fVar12 != 0.0) & (uint)fVar12 |
                    (uint)(1.0 / fVar12) & -(uint)(fVar12 != 0.0));
    lVar9 = w[1];
    lVar10 = w[3];
    lVar11 = 0;
    do {
      fVar1 = *(float *)(lVar9 + 4 + lVar11 * 4);
      fVar2 = *(float *)(lVar9 + 8 + lVar11 * 4);
      fVar3 = *(float *)(lVar9 + 0xc + lVar11 * 4);
      fVar4 = *(float *)(lVar9 + 0x10 + lVar11 * 4);
      fVar5 = *(float *)(lVar9 + 0x14 + lVar11 * 4);
      fVar6 = *(float *)(lVar9 + 0x18 + lVar11 * 4);
      fVar7 = *(float *)(lVar9 + 0x1c + lVar11 * 4);
      *(float *)(lVar10 + lVar11 * 4) = *(float *)(lVar9 + lVar11 * 4) * fVar12;
      *(float *)(lVar10 + 4 + lVar11 * 4) = fVar1 * fVar12;
      *(float *)(lVar10 + 8 + lVar11 * 4) = fVar2 * fVar12;
      *(float *)(lVar10 + 0xc + lVar11 * 4) = fVar3 * fVar12;
      *(float *)(lVar10 + 0x10 + lVar11 * 4) = fVar4 * fVar12;
      *(float *)(lVar10 + 0x14 + lVar11 * 4) = fVar5 * fVar12;
      *(float *)(lVar10 + 0x18 + lVar11 * 4) = fVar6 * fVar12;
      *(float *)(lVar10 + 0x1c + lVar11 * 4) = fVar7 * fVar12;
      lVar11 = lVar11 + 8;
    } while ((int)tVar8 != (int)lVar11);
  }
  return w + 5;
}

Assistant:

t_int *scalarover_perf8(t_int *w)
{
    t_sample *in = (t_sample *)(w[1]);
    t_float g = *(t_float *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    if (g) g = 1.f / g;
    for (; n; n -= 8, in += 8, out += 8)
    {
        t_sample f0 = in[0], f1 = in[1], f2 = in[2], f3 = in[3];
        t_sample f4 = in[4], f5 = in[5], f6 = in[6], f7 = in[7];

        out[0] = f0 * g; out[1] = f1 * g; out[2] = f2 * g; out[3] = f3 * g;
        out[4] = f4 * g; out[5] = f5 * g; out[6] = f6 * g; out[7] = f7 * g;
    }
    return (w+5);
}